

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall icu_63::number::impl::DecimalQuantity::readIntToBcd(DecimalQuantity *this,int32_t n)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (n == 0) {
    uVar4 = 0;
    iVar3 = 0x10;
  }
  else {
    iVar3 = 0x10;
    uVar4 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)n;
      uVar2 = n + 9;
      uVar4 = uVar4 >> 4 |
              (ulong)(n + (SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) >> 2 & 0xfffffffe) * -5)
              << 0x3c;
      n = n / 10;
      iVar3 = iVar3 + -1;
    } while (0x12 < uVar2);
  }
  (this->fBCD).bcdLong = uVar4 >> ((char)iVar3 * '\x04' & 0x3fU);
  this->scale = 0;
  this->precision = 0x10 - iVar3;
  return;
}

Assistant:

void DecimalQuantity::readIntToBcd(int32_t n) {
    U_ASSERT(n != 0);
    // ints always fit inside the long implementation.
    uint64_t result = 0L;
    int i = 16;
    for (; n != 0; n /= 10, i--) {
        result = (result >> 4) + ((static_cast<uint64_t>(n) % 10) << 60);
    }
    U_ASSERT(!usingBytes);
    fBCD.bcdLong = result >> (i * 4);
    scale = 0;
    precision = 16 - i;
}